

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O2

ostream * toml::operator<<(ostream *os,local_date *date)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)date->year);
  std::operator<<(poVar1,'-');
  poVar1 = std::operator<<(os,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->month + 1);
  std::operator<<(poVar1,'-');
  poVar1 = std::operator<<(os,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(poVar1,(uint)date->day);
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const local_date& date)
{
    os << std::setfill('0') << std::setw(4) << static_cast<int>(date.year )     << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.month) + 1 << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.day  )    ;
    return os;
}